

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desc_sroa.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::DescriptorScalarReplacement::ReplaceLoadedValue
          (DescriptorScalarReplacement *this,Instruction *var,Instruction *value)

{
  bool bVar1;
  Op OVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  DefUseManager *this_00;
  reference ppIVar5;
  IRContext *this_01;
  Instruction *use;
  iterator __end2;
  iterator __begin2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2;
  anon_class_16_2_a667f979 local_78;
  function<bool_(spvtools::opt::Instruction_*)> local_68;
  byte local_41;
  undefined1 local_40 [7];
  bool failed;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> work_list;
  Instruction *value_local;
  Instruction *var_local;
  DescriptorScalarReplacement *this_local;
  
  work_list.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)value;
  OVar2 = opt::Instruction::opcode(value);
  if (OVar2 != OpLoad) {
    __assert_fail("value->opcode() == spv::Op::OpLoad",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/desc_sroa.cpp"
                  ,0x195,
                  "bool spvtools::opt::DescriptorScalarReplacement::ReplaceLoadedValue(Instruction *, Instruction *)"
                 );
  }
  uVar3 = opt::Instruction::GetSingleWordInOperand
                    ((Instruction *)
                     work_list.
                     super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  uVar4 = opt::Instruction::result_id(var);
  if (uVar3 != uVar4) {
    __assert_fail("value->GetSingleWordInOperand(0) == var->result_id()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/desc_sroa.cpp"
                  ,0x196,
                  "bool spvtools::opt::DescriptorScalarReplacement::ReplaceLoadedValue(Instruction *, Instruction *)"
                 );
  }
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             local_40);
  this_00 = Pass::get_def_use_mgr(&this->super_Pass);
  uVar3 = opt::Instruction::result_id
                    ((Instruction *)
                     work_list.
                     super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_78.work_list =
       (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
       local_40;
  local_78.this = this;
  std::function<bool(spvtools::opt::Instruction*)>::
  function<spvtools::opt::DescriptorScalarReplacement::ReplaceLoadedValue(spvtools::opt::Instruction*,spvtools::opt::Instruction*)::__0,void>
            ((function<bool(spvtools::opt::Instruction*)> *)&local_68,&local_78);
  bVar1 = analysis::DefUseManager::WhileEachUser(this_00,uVar3,&local_68);
  std::function<bool_(spvtools::opt::Instruction_*)>::~function(&local_68);
  local_41 = (bVar1 ^ 0xffU) & 1;
  if (local_41 == 0) {
    __end2 = std::
             vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
             begin((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    *)local_40);
    use = (Instruction *)
          std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
          end((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *
              )local_40);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                  *)&use);
      if (!bVar1) break;
      ppIVar5 = __gnu_cxx::
                __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                ::operator*(&__end2);
      bVar1 = ReplaceCompositeExtract(this,var,*ppIVar5);
      if (!bVar1) {
        this_local._7_1_ = false;
        goto LAB_0093a51f;
      }
      __gnu_cxx::
      __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
      ::operator++(&__end2);
    }
    this_01 = Pass::context(&this->super_Pass);
    IRContext::KillInst(this_01,(Instruction *)
                                work_list.
                                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
LAB_0093a51f:
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::~vector
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             local_40);
  return this_local._7_1_;
}

Assistant:

bool DescriptorScalarReplacement::ReplaceLoadedValue(Instruction* var,
                                                     Instruction* value) {
  // |var| is the global variable that has to be eliminated (OpVariable).
  // |value| is the OpLoad instruction that has loaded |var|.
  // The function expects all users of |value| to be OpCompositeExtract
  // instructions. Otherwise the function returns false with an error message.
  assert(value->opcode() == spv::Op::OpLoad);
  assert(value->GetSingleWordInOperand(0) == var->result_id());
  std::vector<Instruction*> work_list;
  bool failed = !get_def_use_mgr()->WhileEachUser(
      value->result_id(), [this, &work_list](Instruction* use) {
        if (use->opcode() != spv::Op::OpCompositeExtract) {
          context()->EmitErrorMessage(
              "Variable cannot be replaced: invalid instruction", use);
          return false;
        }
        work_list.push_back(use);
        return true;
      });

  if (failed) {
    return false;
  }

  for (Instruction* use : work_list) {
    if (!ReplaceCompositeExtract(var, use)) {
      return false;
    }
  }

  // All usages of the loaded value have been killed. We can kill the OpLoad.
  context()->KillInst(value);
  return true;
}